

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O3

void GenerateMixingConstants(void)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint v;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint32_t v_00;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int bitfail;
  int primefail;
  int matchfail;
  uint8_t match [256];
  uint local_150;
  int local_148;
  uint local_144;
  uint local_140;
  uint local_13c;
  undefined1 local_138 [64];
  undefined1 local_f8 [64];
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  
  uVar11 = 0;
  local_148 = 0;
  local_144 = 0;
  local_140 = 0;
  local_13c = 0;
  local_150 = 0;
  uVar9 = 0xeb8f1b15;
  uVar8 = 0x97b2ebee;
  uVar12 = 0x5fa2f65b;
  uVar4 = 0x784bf0ba;
LAB_0016a37f:
  v = uVar9;
  uVar2 = popcount(v);
  uVar10 = (ulong)v;
  if (uVar2 < 0x10) {
    uVar10 = 0;
  }
  v_00 = (uint32_t)uVar10;
  uVar3 = popcount(v_00);
  local_13c = local_13c + (0x10 < uVar3) + (uint)(uVar2 < 0x10);
  if (0x10 >= uVar3 && v_00 != 0) {
    iVar7 = 0;
    do {
      bVar1 = (byte)iVar7 & 0x1f;
      uVar9 = (v_00 << bVar1 | v_00 >> 0x20 - bVar1) & 0xff;
      uVar2 = popcount(uVar9);
      if (uVar2 < 3) {
LAB_0016a4b4:
        local_150 = local_150 + 1;
        goto LAB_0016a4bd;
      }
      uVar2 = popcount(uVar9);
      if (5 < uVar2) goto LAB_0016a4b4;
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0x20);
    local_78 = ZEXT1664(ZEXT816(0) << 0x40);
    iVar7 = 0;
    local_b8 = local_78;
    local_f8 = local_78;
    local_138 = local_78;
    do {
      bVar1 = (byte)iVar7 & 0x1f;
      uVar9 = (v_00 << bVar1 | v_00 >> 0x20 - bVar1) & 0xff;
      if (local_138[uVar9] != '\0') {
        local_140 = local_140 + 1;
        goto LAB_0016a4bd;
      }
      iVar7 = iVar7 + 1;
      local_138[uVar9] = 1;
    } while (iVar7 != 0x20);
    lVar5 = 0;
    do {
      if ((int)(uVar10 % (ulong)*(uint *)((long)&DAT_00189140 + lVar5)) == 0) goto LAB_0016a4f9;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0xd8);
    uVar6 = 0xff;
    do {
      uVar9 = (int)uVar6 + 2;
      uVar6 = (ulong)uVar9;
      if ((int)(uVar10 % uVar6) == 0) goto LAB_0016a4f9;
    } while (uVar9 < 0xfffe);
    printf("0x%08x : 0x%08x\n",uVar10,(ulong)~v_00);
    local_148 = local_148 + 1;
  }
  goto LAB_0016a4bd;
LAB_0016a4f9:
  local_144 = local_144 + 1;
LAB_0016a4bd:
  uVar11 = uVar11 + 1;
  uVar4 = uVar4 << 0xb ^ uVar4;
  uVar9 = uVar8;
  uVar8 = uVar12;
  uVar12 = uVar4 >> 8 ^ uVar12 >> 0x13 ^ uVar12 ^ uVar4;
  uVar4 = v;
  if (99 < local_148) {
    printf("%d %d %d %d %d %d\n",(ulong)uVar11,(ulong)local_13c,(ulong)local_150,(ulong)local_140,
           (ulong)local_144,local_148);
    return;
  }
  goto LAB_0016a37f;
}

Assistant:

void GenerateMixingConstants ( void )
{
  Rand r(8350147);

  int count = 0;

  int trials = 0;
  int bitfail = 0;
  int popfail = 0;
  int matchfail = 0;
  int primefail = 0;

  //for(uint32_t x = 1; x; x++)
  while(count < 100)
  {
    //if(x % 100000000 == 0) printf(".");

    trials++;
    uint32_t b = r.rand_u32();
    //uint32_t b = x;

    //----------
    // must have between 14 and 18 set bits

    if(popcount(b) < 16) { b = 0; popfail++; }
    if(popcount(b) > 16) { b = 0; popfail++; }

    if(b == 0) continue;

    //----------
    // must have 3-5 bits set per 8-bit window

    for(int i = 0; i < 32; i++)
    {
      uint32_t c = ROTL32(b,i) & 0xFF;

      if(popcount(c) < 3) { b = 0; bitfail++; break; }
      if(popcount(c) > 5) { b = 0; bitfail++; break; }
    }

    if(b == 0) continue;

    //----------
    // all 8-bit windows must be different

    uint8_t match[256];

    memset(match,0,256);

    for(int i = 0; i < 32; i++)
    {
      uint32_t c = ROTL32(b,i) & 0xFF;
      
      if(match[c]) { b = 0; matchfail++; break; }

      match[c] = 1;
    }

    if(b == 0) continue;

    //----------
    // must be prime

    if(!isprime(b))
    {
      b = 0;
      primefail++;
    }

    if(b == 0) continue;

    //----------

    if(b)
    {
      printf("0x%08x : 0x%08x\n",b,~b);
      count++;
    }
  }

  printf("%d %d %d %d %d %d\n",trials,popfail,bitfail,matchfail,primefail,count);
}